

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O1

void rw::xbox::skinUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  int iVar1;
  Skin *this;
  void *pvVar2;
  int iVar3;
  long lVar4;
  uint8 *puVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint8 local_4c [4];
  float local_48 [6];
  
  defaultUninstanceCB(geo,header);
  this = *(Skin **)((long)geo->texCoords + (long)skinGlobals + -0x38);
  if (this != (Skin *)0x0) {
    pvVar2 = this->platformData;
    puVar5 = this->data;
    pfVar6 = this->inverseMatrices;
    Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
    memcpy(this->inverseMatrices,pfVar6,(long)this->numBones << 6);
    (*DAT_00149de0)(puVar5);
    if (0 < this->numUsedBones) {
      lVar4 = 0;
      do {
        this->usedBones[lVar4] = *(uint8 *)((long)pvVar2 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->numUsedBones);
    }
    iVar3 = header->numVertices;
    if (iVar3 != 0) {
      puVar5 = this->indices;
      pfVar6 = this->weights;
      lVar4 = *(long *)((long)pvVar2 + 0x808);
      do {
        local_48[0] = 0.0;
        local_48[1] = 0.0;
        local_48[2] = 0.0;
        local_48[3] = 0.0;
        local_4c[0] = '\0';
        local_4c[1] = '\0';
        local_4c[2] = '\0';
        local_4c[3] = '\0';
        iVar1 = this->numWeights;
        lVar7 = (long)iVar1;
        if (0 < lVar7) {
          lVar8 = 0;
          do {
            local_48[lVar8] = (float)*(byte *)(lVar4 + lVar8) / 255.0;
            lVar8 = lVar8 + 1;
          } while (lVar7 != lVar8);
          lVar4 = lVar4 + lVar8;
        }
        if (0 < iVar1) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            local_4c[lVar9] =
                 *(uint8 *)((long)pvVar2 + (ulong)(*(ushort *)(lVar4 + lVar9 * 2) / 3) * 4);
            if ((local_48[lVar9] == 0.0) && (!NAN(local_48[lVar9]))) {
              local_4c[lVar9] = '\0';
            }
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + -2;
          } while (lVar7 != lVar9);
          lVar4 = lVar4 - lVar8;
        }
        iVar3 = iVar3 + -1;
        lVar7 = 0;
        lVar8 = 0;
        do {
          pfVar6[lVar8] = local_48[lVar8];
          puVar5[lVar8] = local_4c[lVar8];
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + -4;
        } while (lVar8 != 4);
        puVar5 = puVar5 + 4;
        pfVar6 = (float *)((long)pfVar6 - lVar7);
      } while (iVar3 != 0);
    }
    (*DAT_00149de0)(*(undefined8 *)((long)pvVar2 + 0x808));
    (*DAT_00149de0)(pvVar2);
  }
  return;
}

Assistant:

void
skinUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	defaultUninstanceCB(geo, header);

	Skin *skin = Skin::get(geo);
	if(skin == nil)
		return;
	NativeSkin *natskin = (NativeSkin*)skin->platformData;

	uint8 *data = skin->data;
	float *invMats = skin->inverseMatrices;
	skin->init(skin->numBones, natskin->numUsedBones, geo->numVertices);
	memcpy(skin->inverseMatrices, invMats, skin->numBones*64);
	rwFree(data);

	for(int32 j = 0; j < skin->numUsedBones; j++)
		skin->usedBones[j] = natskin->table1[j];

	float *weights = skin->weights;
	uint8 *indices = skin->indices;
	uint8 *p = (uint8*)natskin->vertexBuffer;
	int32 numVertices = header->numVertices;
	float w[4];
	uint8 i[4];
	uint16 *ip;
	while(numVertices--){
		w[0] = w[1] = w[2] = w[3] = 0.0f;
		i[0] = i[1] = i[2] = i[3] = 0;

		for(int32 j = 0; j < skin->numWeights; j++)
			w[j] = *p++/255.0f;

		ip = (uint16*)p;
		for(int32 j = 0; j < skin->numWeights; j++){
			i[j] = natskin->table1[*ip++/3];
			if(w[j] == 0.0f) i[j] = 0;	// clean up a bit
		}
		p = (uint8*)ip;

		for(int32 j = 0; j < 4; j++){
			*weights++ = w[j];
			*indices++ = i[j];
		}
	}

	rwFree(natskin->vertexBuffer);
	rwFree(natskin);
}